

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_filehandle.cc
# Opt level: O2

RC __thiscall PF_FileHandle::MarkDirty(PF_FileHandle *this,PageNum pageNum)

{
  RC RVar1;
  
  if (this->bFileOpen == 0) {
    RVar1 = 5;
  }
  else {
    RVar1 = 3;
    if ((-1 < pageNum) && (pageNum < (this->hdr).numPages)) {
      RVar1 = PF_BufferMgr::MarkDirty(this->pBufferMgr,this->unixfd,pageNum);
      return RVar1;
    }
  }
  return RVar1;
}

Assistant:

RC PF_FileHandle::MarkDirty(PageNum pageNum) const
{
   // File must be open
   if (!bFileOpen)
      return (PF_CLOSEDFILE);

   // Validate page number
   if (!IsValidPageNum(pageNum))
      return (PF_INVALIDPAGE);

   // Tell the buffer manager to mark the page dirty
   return (pBufferMgr->MarkDirty(unixfd, pageNum));
}